

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O2

int __thiscall ON_PolyEdgeCurve::FindCurve(ON_PolyEdgeCurve *this,ON_Curve *curve)

{
  int iVar1;
  ON_PolyEdgeSegment *this_00;
  ON_Curve *pOVar2;
  int iVar3;
  int segment_index;
  
  iVar3 = -1;
  if (curve != (ON_Curve *)0x0) {
    iVar1 = ON_PolyCurve::Count(&this->super_ON_PolyCurve);
    segment_index = 0;
    if (iVar1 < 1) {
      iVar1 = 0;
      segment_index = 0;
    }
    while ((iVar3 = -1, iVar1 != segment_index &&
           ((this_00 = SegmentCurve(this,segment_index), this_00 == (ON_PolyEdgeSegment *)0x0 ||
            (((iVar3 = segment_index, this_00 != (ON_PolyEdgeSegment *)curve &&
              (pOVar2 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy), pOVar2 != curve))
             && (this_00->m_edge != (ON_BrepEdge *)curve))))))) {
      segment_index = segment_index + 1;
    }
  }
  return iVar3;
}

Assistant:

int ON_PolyEdgeCurve::FindCurve( const ON_Curve* curve) const
{
  int rc = -1;
  if ( 0 != curve )
  {
    int i, count = SegmentCount();
    for( i = 0; i < count; i++)
    {
      ON_PolyEdgeSegment* segment = SegmentCurve(i);
      if (    0 != segment 
           && (curve == segment || curve == segment->ProxyCurve() || curve == segment->BrepEdge()) )
      {
        rc = i;
        break;
      }
    }
  }
  return rc;
}